

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter_properties.h
# Opt level: O3

bool __thiscall BamTools::PropertyFilterValue::check(PropertyFilterValue *this,string *query)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  Impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pIVar4;
  byte extraout_var;
  long lVar5;
  
  bVar2 = Variant::is_type<std::__cxx11::string>(&this->Value);
  if (!bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot compare different types!",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    return false;
  }
  pIVar4 = Variant::CastFromBase<std::__cxx11::string>((this->Value).data);
  if (STARTS_WITH < this->Type) {
    return false;
  }
  switch(this->Type) {
  case CONTAINS:
    lVar5 = std::__cxx11::string::find((char *)query,(ulong)(pIVar4->data)._M_dataplus._M_p,0);
    bVar2 = lVar5 == -1;
    goto LAB_00161e40;
  case ENDS_WITH:
    lVar5 = std::__cxx11::string::find((char *)query,(ulong)(pIVar4->data)._M_dataplus._M_p,0);
    bVar2 = lVar5 == query->_M_string_length - (pIVar4->data)._M_string_length;
    break;
  case EXACT:
    sVar1 = query->_M_string_length;
    if (sVar1 != (pIVar4->data)._M_string_length) {
      return false;
    }
    if (sVar1 == 0) {
      return true;
    }
    iVar3 = bcmp((query->_M_dataplus)._M_p,(pIVar4->data)._M_dataplus._M_p,sVar1);
    return iVar3 == 0;
  case GREATER_THAN:
    iVar3 = std::__cxx11::string::compare((string *)query);
    bVar2 = 0 < iVar3;
    break;
  case GREATER_THAN_EQUAL:
    iVar3 = std::__cxx11::string::compare((string *)query);
    bVar2 = -1 < iVar3;
    break;
  case LESS_THAN:
    std::__cxx11::string::compare((string *)query);
    bVar2 = (bool)(extraout_var >> 7);
    break;
  case LESS_THAN_EQUAL:
    iVar3 = std::__cxx11::string::compare((string *)query);
    bVar2 = iVar3 < 1;
    break;
  case NOT:
    sVar1 = query->_M_string_length;
    if (sVar1 != (pIVar4->data)._M_string_length) {
      return true;
    }
    if (sVar1 == 0) {
      return false;
    }
    iVar3 = bcmp((query->_M_dataplus)._M_p,(pIVar4->data)._M_dataplus._M_p,sVar1);
    bVar2 = iVar3 == 0;
LAB_00161e40:
    bVar2 = !bVar2;
    break;
  case STARTS_WITH:
    lVar5 = std::__cxx11::string::find((char *)query,(ulong)(pIVar4->data)._M_dataplus._M_p,0);
    bVar2 = lVar5 == 0;
  }
  return bVar2;
}

Assistant:

inline bool PropertyFilterValue::check(const std::string& query) const
{

    // ensure filter value & query are same type
    if (!Value.is_type<std::string>()) {
        std::cerr << "Cannot compare different types!" << std::endl;
        return false;
    }

    // localize string version of our filter value
    const std::string& valueString = Value.get<std::string>();

    // string matching based on our filter type
    switch (Type) {
        case (PropertyFilterValue::CONTAINS):
            return (query.find(valueString) != std::string::npos);
        case (PropertyFilterValue::ENDS_WITH):
            return (query.find(valueString) == (query.length() - valueString.length()));
        case (PropertyFilterValue::EXACT):
            return (query == valueString);
        case (PropertyFilterValue::GREATER_THAN):
            return (query > valueString);
        case (PropertyFilterValue::GREATER_THAN_EQUAL):
            return (query >= valueString);
        case (PropertyFilterValue::LESS_THAN):
            return (query < valueString);
        case (PropertyFilterValue::LESS_THAN_EQUAL):
            return (query <= valueString);
        case (PropertyFilterValue::NOT):
            return (query != valueString);
        case (PropertyFilterValue::STARTS_WITH):
            return (query.find(valueString) == 0);
        default:
            BAMTOOLS_ASSERT_UNREACHABLE;
    }
    return false;
}